

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

char * __thiscall CVmObjDate::cast_to_string(CVmObjDate *this,vm_obj_id_t self,vm_val_t *newstr)

{
  vm_obj_id_t vVar1;
  size_t bytelen;
  char *pcVar2;
  char buf [64];
  char acStack_58 [72];
  
  format_string_buf(this,acStack_58,0x40);
  bytelen = strlen(acStack_58);
  vVar1 = CVmObjString::create(0,acStack_58,bytelen);
  newstr->typ = VM_OBJ;
  (newstr->val).obj = vVar1;
  pcVar2 = vm_val_t::get_as_string(newstr);
  return pcVar2;
}

Assistant:

const char *CVmObjDate::cast_to_string(
    VMG_ vm_obj_id_t self, vm_val_t *newstr) const
{
    /* format the date into a buffer */
    char buf[64];
    format_string_buf(vmg_ buf, sizeof(buf));

    /* create the return string */
    newstr->set_obj(CVmObjString::create(vmg_ FALSE, buf, strlen(buf)));
    return newstr->get_as_string(vmg0_);
}